

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O1

clip_image_size
image_manipulation::calc_size_preserved_ratio
          (clip_image_size *inp_size,int align_size,int max_dimension)

{
  clip_image_size cVar1;
  clip_image_size cVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  cVar2.width = 0;
  cVar2.height = 0;
  cVar1.width = 0;
  cVar1.height = 0;
  if ((((0 < inp_size->width) && (0 < max_dimension)) && (0 < align_size)) &&
     (cVar2 = cVar1, 0 < inp_size->height)) {
    auVar3._0_4_ = (float)max_dimension;
    auVar5._0_4_ = (float)inp_size->height;
    auVar5._4_4_ = (float)inp_size->width;
    auVar5._8_8_ = 0;
    auVar3._4_4_ = auVar3._0_4_;
    auVar3._8_4_ = auVar3._0_4_;
    auVar3._12_4_ = auVar3._0_4_;
    auVar4 = divps(auVar3,auVar5);
    if (auVar4._4_4_ <= auVar4._0_4_) {
      auVar4._4_12_ = auVar4._4_12_;
      auVar4._0_4_ = auVar4._4_4_;
    }
    if (1.0 <= auVar4._0_4_) {
      auVar4._0_4_ = 0x3f800000;
    }
    cVar2.width = ((int)(auVar5._4_4_ * auVar4._0_4_) + align_size) - 1U & -align_size;
    cVar2.height = ((int)(auVar4._0_4_ * auVar5._0_4_) + align_size) - 1U & -align_size;
  }
  return cVar2;
}

Assistant:

static clip_image_size calc_size_preserved_ratio(const clip_image_size & inp_size, const int align_size, const int max_dimension) {
        if (inp_size.width <= 0 || inp_size.height <= 0 || align_size <= 0 || max_dimension <= 0) {
            return {0, 0};
        }

        float scale = std::min(1.0f, std::min(static_cast<float>(max_dimension) / inp_size.width,
                                              static_cast<float>(max_dimension) / inp_size.height));

        float target_width_f  = static_cast<float>(inp_size.width)  * scale;
        float target_height_f = static_cast<float>(inp_size.height) * scale;

        int aligned_width  = GGML_PAD((int)target_width_f,  align_size);
        int aligned_height = GGML_PAD((int)target_height_f, align_size);

        return {aligned_width, aligned_height};
    }